

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLProgram.cpp
# Opt level: O0

void __thiscall Diligent::GLProgram::~GLProgram(GLProgram *this)

{
  GLProgram *this_local;
  
  std::shared_ptr<const_Diligent::ShaderResourcesGL>::~shared_ptr(&this->m_pResources);
  std::__cxx11::string::~string((string *)&this->m_InfoLog);
  std::vector<const_Diligent::ShaderGLImpl_*,_std::allocator<const_Diligent::ShaderGLImpl_*>_>::
  ~vector(&this->m_AttachedShaders);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLProgramObjCreateReleaseHelper>::~GLObjWrapper
            (&this->m_GLProg);
  return;
}

Assistant:

GLProgram::~GLProgram()
{
}